

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O0

void __thiscall capnp::MembraneHook::~MembraneHook(MembraneHook *this)

{
  MembraneHook *this_local;
  
  if ((this->revoked & 1U) == 0) {
    removeFromMap(this);
  }
  kj::Promise<void>::~Promise(&this->revocationTask);
  kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::~Maybe(&this->resolved);
  kj::Own<capnp::MembranePolicy,_std::nullptr_t>::~Own(&this->policy);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own(&this->inner);
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

~MembraneHook() noexcept(false) {
    if (!revoked) {
      removeFromMap();
    }
  }